

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe.cpp
# Opt level: O2

void fe_pow22523(i32 *out,i32 *z)

{
  int iVar1;
  bool bVar2;
  fe t1;
  fe t0;
  fe t2;
  
  fe_sq(t0,z);
  fe_sq(t1,t0);
  fe_sq(t1,t1);
  fe_mul(t1,z,t1);
  fe_mul(t0,t0,t1);
  fe_sq(t0,t0);
  fe_mul(t0,t1,t0);
  fe_sq(t1,t0);
  iVar1 = 4;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq(t1,t1);
  }
  fe_mul(t0,t1,t0);
  fe_sq(t1,t0);
  iVar1 = 9;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq(t1,t1);
  }
  fe_mul(t1,t1,t0);
  fe_sq(t2,t1);
  iVar1 = 0x13;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq(t2,t2);
  }
  fe_mul(t1,t2,t1);
  fe_sq(t1,t1);
  iVar1 = 9;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq(t1,t1);
  }
  fe_mul(t0,t1,t0);
  fe_sq(t1,t0);
  iVar1 = 0x31;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq(t1,t1);
  }
  fe_mul(t1,t1,t0);
  fe_sq(t2,t1);
  iVar1 = 99;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq(t2,t2);
  }
  fe_mul(t1,t2,t1);
  fe_sq(t1,t1);
  iVar1 = 0x31;
  while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
    fe_sq(t1,t1);
  }
  fe_mul(t0,t1,t0);
  fe_sq(t0,t0);
  fe_sq(t0,t0);
  fe_mul(out,t0,z);
  return;
}

Assistant:

void fe_pow22523(fe out, const fe z) {
    fe t0;
    fe t1;
    fe t2;
    int i;
    fe_sq(t0, z);

    fe_sq(t1, t0);

    for (i = 1; i < 2; ++i) {
        fe_sq(t1, t1);
    }

    fe_mul(t1, z, t1);
    fe_mul(t0, t0, t1);
    fe_sq(t0, t0);

    fe_mul(t0, t1, t0);
    fe_sq(t1, t0);

    for (i = 1; i < 5; ++i) {
        fe_sq(t1, t1);
    }

    fe_mul(t0, t1, t0);
    fe_sq(t1, t0);

    for (i = 1; i < 10; ++i) {
        fe_sq(t1, t1);
    }

    fe_mul(t1, t1, t0);
    fe_sq(t2, t1);

    for (i = 1; i < 20; ++i) {
        fe_sq(t2, t2);
    }

    fe_mul(t1, t2, t1);
    fe_sq(t1, t1);

    for (i = 1; i < 10; ++i) {
        fe_sq(t1, t1);
    }

    fe_mul(t0, t1, t0);
    fe_sq(t1, t0);

    for (i = 1; i < 50; ++i) {
        fe_sq(t1, t1);
    }

    fe_mul(t1, t1, t0);
    fe_sq(t2, t1);

    for (i = 1; i < 100; ++i) {
        fe_sq(t2, t2);
    }

    fe_mul(t1, t2, t1);
    fe_sq(t1, t1);

    for (i = 1; i < 50; ++i) {
        fe_sq(t1, t1);
    }

    fe_mul(t0, t1, t0);
    fe_sq(t0, t0);

    for (i = 1; i < 2; ++i) {
        fe_sq(t0, t0);
    }

    fe_mul(out, t0, z);
}